

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

int __thiscall asmjit::v1_14::CodeHolder::init(CodeHolder *this,EVP_PKEY_CTX *ctx)

{
  Error EVar1;
  Error EVar2;
  uint64_t in_RCX;
  undefined8 *in_RDX;
  Section *section;
  Error err;
  char *in_stack_00000370;
  int in_stack_0000037c;
  char *in_stack_00000380;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar4;
  uint32_t in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ZoneVector<asmjit::v1_14::Section_*> *in_stack_ffffffffffffff90;
  Section *in_stack_ffffffffffffffa8;
  Error local_4c;
  Error local_24;
  
  if ((this->_environment)._arch == kUnknown) {
    if (*(int *)&this->field_0xd0 != 0) {
      DebugUtils::assertionFailed(in_stack_00000380,in_stack_0000037c,in_stack_00000370);
    }
    EVar1 = ZoneVector<asmjit::v1_14::Section_*>::willGrow
                      (in_stack_ffffffffffffff90,
                       (ZoneAllocator *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       in_stack_ffffffffffffff84);
    EVar2 = ZoneVector<asmjit::v1_14::Section_*>::willGrow
                      (in_stack_ffffffffffffff90,
                       (ZoneAllocator *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       in_stack_ffffffffffffff84);
    local_4c = EVar1 | EVar2;
    if (local_4c == 0) {
      in_stack_ffffffffffffffa8 =
           ZoneAllocator::allocZeroedT<asmjit::v1_14::Section>
                     ((ZoneAllocator *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                      ,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (in_stack_ffffffffffffffa8 == (Section *)0x0) {
        local_4c = DebugUtils::errored(1);
      }
      else {
        in_stack_ffffffffffffffa8->_flags = kReadOnly|kExecutable;
        uVar3 = 0;
        uVar4 = 0;
        CodeHolder_setSectionDefaultName
                  (in_stack_ffffffffffffffa8,'.','t','e','x','t','\0','\0','\0');
        ZoneVector<asmjit::v1_14::Section_*>::appendUnsafe
                  ((ZoneVector<asmjit::v1_14::Section_*> *)CONCAT44(in_stack_ffffffffffffff84,uVar4)
                   ,(Section **)CONCAT44(in_stack_ffffffffffffff7c,uVar3));
        ZoneVector<asmjit::v1_14::Section_*>::appendUnsafe
                  ((ZoneVector<asmjit::v1_14::Section_*> *)CONCAT44(in_stack_ffffffffffffff84,uVar4)
                   ,(Section **)CONCAT44(in_stack_ffffffffffffff7c,uVar3));
      }
    }
    if (local_4c == 0) {
      this->_environment = *(Environment *)ctx;
      *(undefined8 *)&this->_cpuFeatures = *in_RDX;
      *(undefined8 *)&this->field_0x10 = in_RDX[1];
      *(undefined8 *)&this->field_0x18 = in_RDX[2];
      *(undefined8 *)&this->field_0x20 = in_RDX[3];
      this->_baseAddress = in_RCX;
      local_24 = 0;
    }
    else {
      Zone::reset((Zone *)in_stack_ffffffffffffffa8,(ResetPolicy)((ulong)this >> 0x20));
      local_24 = local_4c;
    }
  }
  else {
    local_24 = DebugUtils::errored(6);
  }
  return local_24;
}

Assistant:

Error CodeHolder::init(const Environment& environment, const CpuFeatures& cpuFeatures, uint64_t baseAddress) noexcept {
  // Cannot reinitialize if it's locked or there is one or more emitter attached.
  if (isInitialized())
    return DebugUtils::errored(kErrorAlreadyInitialized);

  // If we are just initializing there should be no emitters attached.
  ASMJIT_ASSERT(_emitters.empty());

  // Create a default section and insert it to the `_sections` array.
  Error err = _sections.willGrow(&_allocator) |
              _sectionsByOrder.willGrow(&_allocator);
  if (err == kErrorOk) {
    Section* section = _allocator.allocZeroedT<Section>();
    if (ASMJIT_LIKELY(section)) {
      section->_flags = SectionFlags::kExecutable | SectionFlags::kReadOnly;
      CodeHolder_setSectionDefaultName(section, '.', 't', 'e', 'x', 't');
      _sections.appendUnsafe(section);
      _sectionsByOrder.appendUnsafe(section);
    }
    else {
      err = DebugUtils::errored(kErrorOutOfMemory);
    }
  }

  if (ASMJIT_UNLIKELY(err)) {
    _zone.reset();
    return err;
  }
  else {
    _environment = environment;
    _cpuFeatures = cpuFeatures;
    _baseAddress = baseAddress;
    return kErrorOk;
  }
}